

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O0

void __thiscall
duckdb::ClientContext::CheckIfPreparedStatementIsExecutable
          (ClientContext *this,PreparedStatementData *statement)

{
  bool bVar1;
  MetaTransaction *pMVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>
  this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>
  db;
  undefined8 uVar3;
  AttachedDatabase *this_01;
  InvalidInputException *this_02;
  long in_RSI;
  optional_ptr<duckdb::AttachedDatabase,_true> entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *modified_database;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>
  *it;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
  *__range1;
  DatabaseManager *manager;
  MetaTransaction *meta_transaction;
  MetaTransaction *in_stack_fffffffffffffe88;
  optional_ptr<duckdb::AttachedDatabase,_true> *in_stack_fffffffffffffe90;
  ClientContext *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  ClientContext *in_stack_ffffffffffffff10;
  DatabaseManager *in_stack_ffffffffffffff18;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  AttachedDatabase *local_60;
  reference local_58;
  reference local_50;
  StatementType type;
  
  ActiveTransaction((ClientContext *)0x86cff9);
  bVar1 = ValidChecker::IsInvalidated<duckdb::MetaTransaction>((MetaTransaction *)0x86d001);
  if ((bVar1) && ((*(byte *)(in_RSI + 0xb8) & 1) != 0)) {
    uVar3 = __cxa_allocate_exception(0x10);
    ErrorManager::InvalidatedTransaction(in_stack_fffffffffffffec8);
    __cxa_throw(uVar3,&TransactionException::typeinfo,TransactionException::~TransactionException);
  }
  pMVar2 = MetaTransaction::Get((ClientContext *)0x86d07e);
  DatabaseManager::Get((ClientContext *)0x86d090);
  this_00._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
                *)in_stack_fffffffffffffe88);
  db._M_cur = (__node_type *)
              ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
              ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>_>
                     *)in_stack_fffffffffffffe88);
  while( true ) {
    bVar1 = ::std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>
                        *)&stack0xffffffffffffffc0,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>
                        *)&stack0xffffffffffffffb8);
    if (!bVar1) {
      return;
    }
    local_58 = ::std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_false,_true>
                            *)0x86d105);
    local_50 = local_58;
    local_60 = (AttachedDatabase *)
               DatabaseManager::GetDatabase
                         (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_60);
    if (!bVar1) break;
    this_01 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(in_stack_fffffffffffffe90);
    bVar1 = AttachedDatabase::IsReadOnly(this_01);
    if (bVar1) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      type = (StatementType)((ulong)db._M_cur >> 0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff10,
                 "Cannot execute statement of type \"%s\" on database \"%s\" which is attached in read-only mode!"
                 ,(allocator *)&stack0xffffffffffffff0f);
      StatementTypeToString_abi_cxx11_(type);
      ::std::__cxx11::string::string((string *)&stack0xfffffffffffffec8,(string *)local_58);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffef8);
      InvalidInputException::InvalidInputException(this_02,(string *)in_stack_fffffffffffffe88);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    in_stack_fffffffffffffe88 = pMVar2;
    optional_ptr<duckdb::AttachedDatabase,_true>::operator*(in_stack_fffffffffffffe90);
    MetaTransaction::ModifyDatabase((MetaTransaction *)this_00._M_cur,(AttachedDatabase *)db._M_cur)
    ;
    ::std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_false,_true>
                  *)in_stack_fffffffffffffe90);
  }
  uVar3 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_80,"Database \"%s\" not found",&local_81);
  ::std::__cxx11::string::string(local_a8,(string *)local_58);
  InternalException::InternalException<std::__cxx11::string>
            ((InternalException *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void ClientContext::CheckIfPreparedStatementIsExecutable(PreparedStatementData &statement) {
	if (ValidChecker::IsInvalidated(ActiveTransaction()) && statement.properties.requires_valid_transaction) {
		throw ErrorManager::InvalidatedTransaction(*this);
	}
	auto &meta_transaction = MetaTransaction::Get(*this);
	auto &manager = DatabaseManager::Get(*this);
	for (auto &it : statement.properties.modified_databases) {
		auto &modified_database = it.first;
		auto entry = manager.GetDatabase(*this, modified_database);
		if (!entry) {
			throw InternalException("Database \"%s\" not found", modified_database);
		}
		if (entry->IsReadOnly()) {
			throw InvalidInputException(StringUtil::Format(
			    "Cannot execute statement of type \"%s\" on database \"%s\" which is attached in read-only mode!",
			    StatementTypeToString(statement.statement_type), modified_database));
		}
		meta_transaction.ModifyDatabase(*entry);
	}
}